

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O1

int __thiscall hanabi_learning_env::HanabiState::Score(HanabiState *this)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  
  iVar2 = 0;
  if (0 < this->life_tokens_) {
    piVar3 = (this->fireworks_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar1 = (this->fireworks_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    iVar2 = 0;
    if (piVar3 != piVar1) {
      iVar2 = 0;
      do {
        iVar2 = iVar2 + *piVar3;
        piVar3 = piVar3 + 1;
      } while (piVar3 != piVar1);
    }
  }
  return iVar2;
}

Assistant:

int HanabiState::Score() const {
  if (LifeTokens() <= 0) {
    return 0;
  }
  return std::accumulate(fireworks_.begin(), fireworks_.end(), 0);
}